

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O1

int prvTidygetArgValueInt(TidyMessageImpl message,TidyMessageArgument *arg)

{
  int iVar1;
  
  iVar1 = *(int *)arg + -1;
  if (message.argcount < iVar1) {
    __assert_fail("argNum <= message.argcount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                  ,0x1d1,"int prvTidygetArgValueInt(TidyMessageImpl, TidyMessageArgument *)");
  }
  if (message.arguments[iVar1].type == tidyFormatType_INT) {
    return message.arguments[iVar1].u.i;
  }
  __assert_fail("message.arguments[argNum].type == tidyFormatType_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                ,0x1d2,"int prvTidygetArgValueInt(TidyMessageImpl, TidyMessageArgument *)");
}

Assistant:

int TY_(getArgValueInt)( TidyMessageImpl message, TidyMessageArgument* arg )
{
    int argNum = (int)(size_t)*arg - 1;
    assert( argNum <= message.argcount );
    assert( message.arguments[argNum].type == tidyFormatType_INT);

    return message.arguments[argNum].u.i;
}